

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandlineflags.cc
# Opt level: O2

bool benchmark::ParseDouble(string *src_text,char *str,double *value)

{
  char cVar1;
  ostream *poVar2;
  double dVar3;
  char *end;
  char *local_30;
  
  local_30 = (char *)0x0;
  dVar3 = strtod(str,&local_30);
  cVar1 = *local_30;
  if (cVar1 == '\0') {
    *value = dVar3;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)src_text);
    poVar2 = std::operator<<(poVar2," is expected to be a double, ");
    poVar2 = std::operator<<(poVar2,"but actually has value \"");
    poVar2 = std::operator<<(poVar2,str);
    std::operator<<(poVar2,"\".\n");
  }
  return cVar1 == '\0';
}

Assistant:

bool ParseDouble(const std::string& src_text, const char* str, double* value) {
  // Parses the environment variable as a decimal integer.
  char* end = nullptr;
  const double double_value = strtod(str, &end);  // NOLINT

  // Has strtol() consumed all characters in the string?
  if (*end != '\0') {
    // No - an invalid character was encountered.
    std::cerr << src_text << " is expected to be a double, "
              << "but actually has value \"" << str << "\".\n";
    return false;
  }

  *value = double_value;
  return true;
}